

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O1

CharClass<wchar_t> * __thiscall
Centaurus::CharClass<wchar_t>::operator|=(CharClass<wchar_t> *this,CharClass<wchar_t> *cc)

{
  vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_> local_48;
  CharClass<wchar_t> local_30;
  
  operator|(&local_30,this,cc);
  local_48.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       (this->m_ranges).
       super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (this->m_ranges).
       super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (this->m_ranges).
       super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       local_30.m_ranges.
       super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       local_30.m_ranges.
       super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       local_30.m_ranges.
       super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_30.m_ranges.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_30.m_ranges.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_30.m_ranges.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::~vector
            (&local_48);
  ~CharClass(&local_30);
  return this;
}

Assistant:

CharClass<TCHAR>& operator|=(const CharClass<TCHAR>& cc)
    {
        return *this = *this | cc;
    }